

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O1

void __thiscall kj::anon_unknown_0::TestCase368::run(TestCase368 *this)

{
  PromiseBase node;
  int iVar1;
  WeakFulfiller<void> *pWVar2;
  DebugExpression<bool> _kjCondition;
  PromiseFulfillerPair<void> pair;
  WaitScope waitScope;
  EventLoop loop;
  DebugExpression<bool> local_e8;
  undefined7 uStack_e7;
  PromiseBase local_e0;
  WeakFulfillerBase *local_d8;
  WeakFulfiller<void> *local_d0;
  EventLoop *local_c8;
  undefined4 local_c0;
  long local_b8;
  undefined8 uStack_b0;
  char *local_a8;
  char *pcStack_a0;
  undefined8 local_98;
  EventLoop local_90;
  
  EventLoop::EventLoop(&local_90);
  local_c0 = 0xffffffff;
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = &local_90;
  EventLoop::enterScope(&local_90);
  pWVar2 = (WeakFulfiller<void> *)operator_new(0x18);
  (pWVar2->super_WeakFulfillerBase).inner = (PromiseRejector *)0x0;
  (pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector =
       (_func_int **)&PTR_reject_00629ab8;
  (pWVar2->super_WeakFulfillerBase).super_Disposer._vptr_Disposer =
       (_func_int **)&PTR_disposeImpl_00629af0;
  kj::_::PromiseDisposer::
  alloc<kj::_::AdapterPromiseNode<kj::_::Void,kj::_::PromiseAndFulfillerAdapter<void>>,kj::_::PromiseDisposer,kj::_::WeakFulfiller<void>&>
            ((PromiseDisposer *)&local_e8,pWVar2);
  local_e0.node.ptr._1_7_ = uStack_e7;
  local_e0.node.ptr._0_1_ = local_e8.value;
  local_d8 = &pWVar2->super_WeakFulfillerBase;
  local_d0 = pWVar2;
  iVar1 = (*(pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector[1])
                    (pWVar2);
  local_e8.value = SUB41(iVar1,0);
  if (kj::_::Debug::minSeverity < 3 && local_e8.value == (PromiseDisposer)0x0) {
    kj::_::Debug::log<char_const(&)[45],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x176,ERROR,"\"failed: expected \" \"pair.fulfiller->isWaiting()\", _kjCondition",
               (char (*) [45])"failed: expected pair.fulfiller->isWaiting()",&local_e8);
  }
  (*(local_d0->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector[2])
            (local_d0,&local_e8);
  iVar1 = (*(local_d0->super_PromiseFulfiller<void>).super_PromiseRejector._vptr_PromiseRejector[1])
                    ();
  local_e8.value = (bool)((byte)iVar1 ^ 1);
  if (((byte)iVar1 & kj::_::Debug::minSeverity < 3) != 0) {
    kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
               ,0x178,ERROR,"\"failed: expected \" \"!(pair.fulfiller->isWaiting())\", _kjCondition"
               ,(char (*) [48])"failed: expected !(pair.fulfiller->isWaiting())",&local_e8);
  }
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
  ;
  pcStack_a0 = "run";
  local_98 = 0x30000017a;
  Promise<void>::wait((Promise<void> *)&local_e0,&local_c8);
  pWVar2 = local_d0;
  if (local_d0 != (WeakFulfiller<void> *)0x0) {
    local_d0 = (WeakFulfiller<void> *)0x0;
    (**(local_d8->super_Disposer)._vptr_Disposer)
              (local_d8,(pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector.
                        _vptr_PromiseRejector[-2] +
                        (long)&(pWVar2->super_PromiseFulfiller<void>).super_PromiseRejector.
                               _vptr_PromiseRejector);
  }
  node.node.ptr = local_e0.node.ptr;
  if (local_e0.node.ptr != (PromiseNode *)0x0) {
    local_e0.node.ptr = (OwnPromiseNode)(PromiseNode *)0x0;
    kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node.node.ptr);
  }
  if (local_b8 == 0) {
    EventLoop::leaveScope(local_c8);
  }
  EventLoop::~EventLoop(&local_90);
  return;
}

Assistant:

TEST(Async, SeparateFulfillerVoid) {
  EventLoop loop;
  WaitScope waitScope(loop);

  auto pair = newPromiseAndFulfiller<void>();

  EXPECT_TRUE(pair.fulfiller->isWaiting());
  pair.fulfiller->fulfill();
  EXPECT_FALSE(pair.fulfiller->isWaiting());

  pair.promise.wait(waitScope);
}